

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cvodes_ls.c
# Opt level: O3

int CVodeSetLSNormFactorB(void *cvode_mem,int which,sunrealtype nrmfacB)

{
  int iVar1;
  CVodeBMem cvB_mem;
  CVLsMemB cvlsB_mem;
  CVadjMem ca_mem;
  CVodeMem cv_mem;
  CVodeBMem local_20;
  CVLsMemB local_18;
  CVadjMem local_10;
  CVodeMem local_8;
  
  iVar1 = cvLs_AccessLMemB(cvode_mem,which,"CVodeSetLSNormFactorB",&local_8,&local_10,&local_20,
                           &local_18);
  if (iVar1 != 0) {
    return iVar1;
  }
  iVar1 = CVodeSetLSNormFactor(local_20->cv_mem,nrmfacB);
  return iVar1;
}

Assistant:

int CVodeSetLSNormFactorB(void* cvode_mem, int which, sunrealtype nrmfacB)
{
  CVodeMem cv_mem;
  CVadjMem ca_mem;
  CVodeBMem cvB_mem;
  CVLsMemB cvlsB_mem;
  void* cvodeB_mem;
  int retval;

  /* access relevant memory structures */
  retval = cvLs_AccessLMemB(cvode_mem, which, __func__, &cv_mem, &ca_mem,
                            &cvB_mem, &cvlsB_mem);
  if (retval != CVLS_SUCCESS) { return (retval); }

  /* call corresponding routine for cvodeB_mem structure */
  cvodeB_mem = (void*)(cvB_mem->cv_mem);
  return (CVodeSetLSNormFactor(cvodeB_mem, nrmfacB));
}